

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inversespectrogram.cpp
# Opt level: O1

int __thiscall
ncnn::InverseSpectrogram::forward
          (InverseSpectrogram *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  float *pfVar11;
  undefined4 *puVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  float *pfVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  undefined4 *puVar20;
  uint *puVar21;
  ulong uVar22;
  uint *puVar23;
  undefined4 *puVar24;
  undefined4 *puVar25;
  long lVar26;
  int k;
  long lVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ulong local_160;
  float local_118;
  float local_114;
  ulong local_110;
  Mat local_108;
  Mat local_b8;
  long local_70;
  void *local_68;
  void *local_60;
  ulong local_58;
  float *local_50;
  long local_48;
  double local_40;
  double local_38;
  
  local_110 = (ulong)(uint)bottom_blob->h;
  iVar2 = bottom_blob->c;
  iVar3 = this->n_fft;
  uVar13 = iVar3 - (iVar3 >> 0x1f) & 0xfffffffe;
  if (this->center == 0) {
    uVar13 = 0;
  }
  uVar13 = (iVar3 - uVar13) + (bottom_blob->h - 1U) * this->hoplen;
  sVar4 = bottom_blob->elemsize;
  if (this->returns == 0) {
    Mat::create(top_blob,2,uVar13,sVar4,opt->blob_allocator);
  }
  else {
    Mat::create(top_blob,uVar13,sVar4,opt->blob_allocator);
  }
  iVar14 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_b8.cstep = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.elemsize._0_4_ = 0;
    local_b8._20_8_ = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.d = 0;
    local_b8.c = 0;
    Mat::create(&local_b8,this->n_fft + uVar13,sVar4,opt->workspace_allocator);
    pvVar6 = local_b8.data;
    iVar14 = -100;
    if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
      uVar8 = top_blob->c * (int)top_blob->cstep;
      if (0 < (int)uVar8) {
        memset(top_blob->data,0,(ulong)uVar8 << 2);
      }
      if (0 < local_b8.c * (int)local_b8.cstep) {
        memset(pvVar6,0,(ulong)(uint)(local_b8.c * (int)local_b8.cstep) << 2);
      }
      if (0 < (int)local_110) {
        local_160 = 0;
        do {
          local_108.cstep = 0;
          local_108.data = (undefined4 *)0x0;
          local_108.refcount._0_4_ = 0;
          local_108.refcount._4_4_ = 0;
          local_108.elemsize._0_4_ = 0;
          local_108.elemsize._4_4_ = 0;
          local_108.elempack = 0;
          local_108.h = 0;
          local_108.d = 0;
          local_108.c = 0;
          local_108.allocator = (Allocator *)0x0;
          local_108.dims = 0;
          local_108.w = 0;
          Mat::create(&local_108,2,this->n_fft,4,(Allocator *)0x0);
          uVar8 = this->n_fft;
          uVar22 = (ulong)uVar8;
          if (iVar2 == iVar3 / 2 + 1) {
            iVar14 = (int)uVar8 / 2;
            if (-2 < (int)uVar8) {
              puVar20 = (undefined4 *)((long)local_108.data + 4);
              uVar22 = (ulong)(iVar14 + 1);
              lVar26 = bottom_blob->elemsize * local_160 * (long)bottom_blob->w;
              lVar10 = bottom_blob->elemsize * bottom_blob->cstep;
              puVar24 = (undefined4 *)((long)bottom_blob->data + lVar26);
              lVar18 = (long)local_108.w *
                       CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              puVar25 = (undefined4 *)((long)bottom_blob->data + lVar26 + 4);
              puVar12 = (undefined4 *)local_108.data;
              do {
                *puVar12 = *puVar24;
                *puVar20 = *puVar25;
                puVar24 = (undefined4 *)((long)puVar24 + lVar10);
                puVar12 = (undefined4 *)((long)puVar12 + lVar18);
                puVar25 = (undefined4 *)((long)puVar25 + lVar10);
                puVar20 = (undefined4 *)((long)puVar20 + lVar18);
                uVar22 = uVar22 - 1;
              } while (uVar22 != 0);
            }
            if (iVar14 + 1 < this->n_fft) {
              sVar4 = bottom_blob->cstep;
              sVar5 = bottom_blob->elemsize;
              lVar10 = (long)this->n_fft + ~(long)iVar14;
              lVar26 = (long)bottom_blob->w * local_160;
              puVar24 = (undefined4 *)((sVar4 * lVar10 + lVar26) * sVar5 + (long)bottom_blob->data);
              lVar18 = (long)local_108.w *
                       CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              puVar23 = (uint *)((long)bottom_blob->data +
                                ((~(long)iVar14 + (long)this->n_fft) * sVar4 + lVar26) * sVar5 + 4);
              lVar26 = (iVar14 + 1) * lVar18;
              puVar20 = (undefined4 *)((long)local_108.data + lVar26);
              puVar21 = (uint *)((long)local_108.data + lVar26 + 4);
              do {
                *puVar20 = *puVar24;
                *puVar21 = *puVar23 ^ 0x80000000;
                puVar24 = (undefined4 *)((long)puVar24 + -(sVar4 * sVar5));
                puVar23 = (uint *)((long)puVar23 + -(sVar4 * sVar5));
                puVar20 = (undefined4 *)((long)puVar20 + lVar18);
                puVar21 = (uint *)((long)puVar21 + lVar18);
                lVar10 = lVar10 + -1;
              } while (lVar10 != 0);
            }
          }
          else if (0 < (int)uVar8) {
            puVar20 = (undefined4 *)((long)local_108.data + 4);
            lVar26 = bottom_blob->elemsize * local_160 * (long)bottom_blob->w;
            lVar10 = bottom_blob->elemsize * bottom_blob->cstep;
            puVar24 = (undefined4 *)((long)bottom_blob->data + lVar26);
            lVar18 = (long)local_108.w *
                     CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
            puVar25 = (undefined4 *)((long)bottom_blob->data + lVar26 + 4);
            puVar12 = (undefined4 *)local_108.data;
            do {
              *puVar12 = *puVar24;
              *puVar20 = *puVar25;
              puVar24 = (undefined4 *)((long)puVar24 + lVar10);
              puVar12 = (undefined4 *)((long)puVar12 + lVar18);
              puVar25 = (undefined4 *)((long)puVar25 + lVar10);
              puVar20 = (undefined4 *)((long)puVar20 + lVar18);
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
          if (this->normalized == 2) {
            iVar14 = this->n_fft;
            if (0 < (long)iVar14) {
              fVar29 = *(float *)((long)(this->window_data).data + (long)iVar14 * 4);
              uVar22 = (ulong)(uint)(iVar14 * 2);
              if (iVar14 * 2 < 2) {
                uVar22 = 1;
              }
              uVar19 = 0;
              do {
                *(float *)((long)local_108.data + uVar19 * 4) =
                     *(float *)((long)local_108.data + uVar19 * 4) * fVar29;
                uVar19 = uVar19 + 1;
              } while (uVar22 != uVar19);
            }
          }
          else if ((this->normalized == 1) && (iVar14 = this->n_fft, 0 < iVar14)) {
            uVar22 = (ulong)(uint)(iVar14 * 2);
            if (iVar14 * 2 < 2) {
              uVar22 = 1;
            }
            uVar19 = 0;
            do {
              *(float *)((long)local_108.data + uVar19 * 4) =
                   *(float *)((long)local_108.data + uVar19 * 4) * SQRT((float)iVar14);
              uVar19 = uVar19 + 1;
            } while (uVar22 != uVar19);
          }
          uVar8 = this->n_fft;
          lVar10 = (long)(int)uVar8;
          if (0 < lVar10) {
            local_40 = 1.0 / (double)(int)uVar8;
            lVar18 = (long)local_108.w;
            local_60 = (this->window_data).data;
            local_58 = (ulong)(uint)(this->hoplen * (int)local_160);
            iVar14 = this->returns;
            uVar17 = uVar8 >> 1;
            local_70 = (long)top_blob->w * top_blob->elemsize;
            local_68 = local_b8.data;
            pvVar6 = top_blob->data;
            if (this->center != 1) {
              uVar17 = 0;
            }
            local_50 = (float *)((long)local_108.data + 4);
            lVar26 = CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
            lVar15 = 0;
            do {
              local_38 = (double)(int)lVar15 * 6.283185307179586;
              fVar29 = 0.0;
              lVar27 = 0;
              fVar30 = 0.0;
              pfVar16 = local_50;
              local_48 = lVar15;
              do {
                sincosf((float)((double)(int)lVar27 * local_38 * local_40),&local_114,&local_118);
                fVar30 = (fVar30 + pfVar16[-1] * local_118) - *pfVar16 * local_114;
                fVar29 = *pfVar16 * local_118 + pfVar16[-1] * local_114 + fVar29;
                lVar27 = lVar27 + 1;
                pfVar16 = (float *)((long)pfVar16 + lVar18 * lVar26);
              } while (lVar10 != lVar27);
              uVar9 = ((int)local_58 + (int)local_48) - uVar17;
              if ((-1 < (int)uVar9) && ((int)uVar9 < (int)uVar13)) {
                fVar1 = *(float *)((long)local_60 + local_48 * 4);
                fVar28 = fVar1 * (1.0 / (float)(int)uVar8);
                fVar29 = fVar29 * fVar28;
                uVar22 = (ulong)uVar9;
                *(float *)((long)local_68 + uVar22 * 4) =
                     fVar1 * fVar1 + *(float *)((long)local_68 + uVar22 * 4);
                if (iVar14 == 2) {
                  pfVar16 = (float *)((long)pvVar6 + uVar22 * 4);
                }
                else {
                  fVar28 = fVar28 * fVar30;
                  if (iVar14 == 1) {
                    pfVar16 = (float *)((long)pvVar6 + uVar22 * 4);
                    fVar29 = fVar28;
                  }
                  else {
                    if (iVar14 != 0) goto LAB_005ec3a8;
                    pfVar11 = (float *)(uVar22 * local_70 + (long)pvVar6);
                    pfVar16 = pfVar11 + 1;
                    *pfVar11 = fVar28 + *pfVar11;
                  }
                }
                *pfVar16 = fVar29 + *pfVar16;
              }
LAB_005ec3a8:
              lVar15 = local_48 + 1;
            } while (lVar15 != lVar10);
          }
          piVar7 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_108.allocator == (Allocator *)0x0) {
                if ((undefined4 *)local_108.data != (undefined4 *)0x0) {
                  free(local_108.data);
                }
              }
              else {
                (*(local_108.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_108.cstep = 0;
          local_108.data = (void *)0x0;
          local_108.refcount._0_4_ = 0;
          local_108.refcount._4_4_ = 0;
          local_108.elemsize._0_4_ = 0;
          local_108.elemsize._4_4_ = 0;
          local_108.elempack = 0;
          local_108.dims = 0;
          local_108.w = 0;
          local_108.h = 0;
          local_108.d = 0;
          local_108.c = 0;
          local_160 = local_160 + 1;
        } while (local_160 != local_110);
      }
      if (this->returns == 0) {
        if (0 < (int)uVar13) {
          iVar2 = top_blob->w;
          sVar4 = top_blob->elemsize;
          pfVar16 = (float *)((long)top_blob->data + 4);
          uVar22 = 0;
          do {
            fVar29 = *(float *)((long)local_b8.data + uVar22 * 4);
            if (fVar29 != 0.0) {
              pfVar16[-1] = pfVar16[-1] / fVar29;
              *pfVar16 = *pfVar16 / *(float *)((long)local_b8.data + uVar22 * 4);
            }
            uVar22 = uVar22 + 1;
            pfVar16 = (float *)((long)pfVar16 + (long)iVar2 * sVar4);
          } while (uVar13 != uVar22);
        }
      }
      else if (0 < (int)uVar13) {
        pvVar6 = top_blob->data;
        uVar22 = 0;
        do {
          fVar29 = *(float *)((long)local_b8.data + uVar22 * 4);
          if (fVar29 != 0.0) {
            *(float *)((long)pvVar6 + uVar22 * 4) = *(float *)((long)pvVar6 + uVar22 * 4) / fVar29;
          }
          uVar22 = uVar22 + 1;
        } while (uVar13 != uVar22);
      }
      iVar14 = 0;
    }
    piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          if (local_b8.data != (void *)0x0) {
            free(local_b8.data);
          }
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar14;
}

Assistant:

int InverseSpectrogram::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // https://github.com/librosa/librosa/blob/main/librosa/core/spectrum.py#L630

    // TODO custom window
    // TODO output length

    const int frames = bottom_blob.h;
    const int freqs = bottom_blob.c;
    // assert freqs == n_fft or freqs == n_fft / 2 + 1

    const int onesided = freqs == n_fft / 2 + 1 ? 1 : 0;

    const int outsize = center ? (frames - 1) * hoplen + (n_fft - n_fft / 2 * 2) : (frames - 1) * hoplen + n_fft;

    const size_t elemsize = bottom_blob.elemsize;

    if (returns == 0)
    {
        top_blob.create(2, outsize, elemsize, opt.blob_allocator);
    }
    else
    {
        top_blob.create(outsize, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    Mat window_sumsquare(outsize + n_fft, elemsize, opt.workspace_allocator);
    if (window_sumsquare.empty())
        return -100;

    top_blob.fill(0.f);
    window_sumsquare.fill(0.f);

    for (int j = 0; j < frames; j++)
    {
        // collect complex
        Mat sp(2, n_fft);
        if (onesided == 1)
        {
            for (int k = 0; k < n_fft / 2 + 1; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(k).row(j)[0];
                sp.row(k)[1] = bottom_blob.channel(k).row(j)[1];
            }
            for (int k = n_fft / 2 + 1; k < n_fft; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(n_fft - k).row(j)[0];
                sp.row(k)[1] = -bottom_blob.channel(n_fft - k).row(j)[1];
            }
        }
        else
        {
            for (int k = 0; k < n_fft; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(k).row(j)[0];
                sp.row(k)[1] = bottom_blob.channel(k).row(j)[1];
            }
        }

        if (normalized == 1)
        {
            float norm = sqrt(n_fft);
            for (int i = 0; i < 2 * n_fft; i++)
            {
                sp[i] *= norm;
            }
        }
        if (normalized == 2)
        {
            float norm = window_data[n_fft];
            for (int i = 0; i < 2 * n_fft; i++)
            {
                sp[i] *= norm;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < n_fft; i++)
        {
            // inverse dft
            float re = 0.f;
            float im = 0.f;
            for (int k = 0; k < n_fft; k++)
            {
                double angle = 2 * 3.14159265358979323846 * i * k / n_fft;

                re += sp.row(k)[0] * cosf(angle) - sp.row(k)[1] * sinf(angle);
                im += sp.row(k)[0] * sinf(angle) + sp.row(k)[1] * cosf(angle);
            }

            re /= n_fft;
            im /= n_fft;

            // apply window
            re *= window_data[i];
            im *= window_data[i];

            int output_index = j * hoplen + i;
            if (center == 1)
            {
                output_index -= n_fft / 2;
            }
            if (output_index >= 0 && output_index < outsize)
            {
                // square window
                window_sumsquare[output_index] += window_data[i] * window_data[i];

                if (returns == 0)
                {
                    top_blob.row(output_index)[0] += re;
                    top_blob.row(output_index)[1] += im;
                }
                if (returns == 1)
                {
                    top_blob[output_index] += re;
                }
                if (returns == 2)
                {
                    top_blob[output_index] += im;
                }
            }
        }
    }

    // square window norm
    if (returns == 0)
    {
        for (int i = 0; i < outsize; i++)
        {
            if (window_sumsquare[i] != 0.f)
            {
                top_blob.row(i)[0] /= window_sumsquare[i];
                top_blob.row(i)[1] /= window_sumsquare[i];
            }
        }
    }
    else
    {
        for (int i = 0; i < outsize; i++)
        {
            if (window_sumsquare[i] != 0.f)
                top_blob[i] /= window_sumsquare[i];
        }
    }

    return 0;
}